

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::findScalarConstant(Builder *this,Op typeClass,Op opcode,Id typeId,uint v1,uint v2)

{
  int iVar1;
  Op OVar2;
  Id IVar3;
  uint uVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  reference ppIVar7;
  Id local_44;
  Id local_40;
  int local_3c;
  Instruction *pIStack_38;
  int i;
  Instruction *constant;
  uint local_28;
  uint v2_local;
  uint v1_local;
  Id typeId_local;
  Op opcode_local;
  Op typeClass_local;
  Builder *this_local;
  
  local_3c = 0;
  constant._4_4_ = v2;
  local_28 = v1;
  v2_local = typeId;
  v1_local = opcode;
  typeId_local = typeClass;
  _opcode_local = this;
  while( true ) {
    iVar1 = local_3c;
    local_40 = typeId_local;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedConstants,&local_40);
    sVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar5);
    if ((int)sVar6 <= iVar1) {
      return 0;
    }
    local_44 = typeId_local;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedConstants,&local_44);
    ppIVar7 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar5,(long)local_3c);
    pIStack_38 = *ppIVar7;
    OVar2 = spv::Instruction::getOpCode(pIStack_38);
    if ((((OVar2 == v1_local) &&
         (IVar3 = spv::Instruction::getTypeId(pIStack_38), IVar3 == v2_local)) &&
        (uVar4 = spv::Instruction::getImmediateOperand(pIStack_38,0), uVar4 == local_28)) &&
       (uVar4 = spv::Instruction::getImmediateOperand(pIStack_38,1), uVar4 == constant._4_4_))
    break;
    local_3c = local_3c + 1;
  }
  IVar3 = spv::Instruction::getResultId(pIStack_38);
  return IVar3;
}

Assistant:

Id Builder::findScalarConstant(Op typeClass, Op opcode, Id typeId, unsigned v1, unsigned v2)
{
    Instruction* constant;
    for (int i = 0; i < (int)groupedConstants[typeClass].size(); ++i) {
        constant = groupedConstants[typeClass][i];
        if (constant->getOpCode() == opcode &&
            constant->getTypeId() == typeId &&
            constant->getImmediateOperand(0) == v1 &&
            constant->getImmediateOperand(1) == v2)
            return constant->getResultId();
    }

    return 0;
}